

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O3

void __thiscall Parser::FinishFncNode(Parser *this,ParseNodeFnc *pnodeFnc,bool fAllowIn)

{
  Scanner_t *this_00;
  FncFlags FVar1;
  uint uVar2;
  LocalFunctionId *pLVar3;
  ParseNodeFnc *pPVar4;
  int32 *piVar5;
  uint *puVar6;
  IdentPtr pIVar7;
  code *pcVar8;
  ParseNodeFnc *pPVar9;
  bool bVar10;
  charcount_t cVar11;
  undefined4 *puVar12;
  IdentPtr pIVar13;
  char *message;
  undefined7 in_register_00000011;
  char *error;
  uint offset;
  uint lineNumber;
  byte bVar14;
  tokens tVar15;
  LocalFunctionId local_58;
  undefined4 local_54;
  LocalFunctionId tempNextFunctionId;
  HashTbl *local_48;
  size_t local_40;
  ParseNodeFnc *local_38;
  
  if (pnodeFnc == (ParseNodeFnc *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                        ,0x1cfb,"(pnodeFnc)","pnodeFnc");
    if (!bVar10) goto LAB_00e6f175;
    *puVar12 = 0;
  }
  local_54 = (undefined4)CONCAT71(in_register_00000011,fAllowIn);
  pLVar3 = this->m_nextFunctionId;
  local_58 = pnodeFnc->functionId + 1;
  this->m_nextFunctionId = &local_58;
  pPVar4 = this->m_currentNodeFunc;
  piVar5 = this->m_pCurrentAstSize;
  puVar6 = this->m_pnestedCount;
  this->m_currentNodeFunc = pnodeFnc;
  this->m_pCurrentAstSize = &pnodeFnc->astSize;
  pnodeFnc->nestedCount = 0;
  this->m_pnestedCount = &pnodeFnc->nestedCount;
  FVar1 = pnodeFnc->fncFlags;
  this_00 = &this->m_scan;
  local_40 = CONCAT44(local_40._4_4_,FVar1);
  local_38 = pnodeFnc;
  if (pnodeFnc->pnodeName == (ParseNodeVar *)0x0) {
    Scanner<UTF8EncodingPolicyBase<false>_>::SetCurrentCharacter
              (this_00,(pnodeFnc->super_ParseNode).ichMin,pnodeFnc->lineNumber);
    if ((FVar1 >> 0x11 & 1) == 0) {
      if ((pnodeFnc->fncFlags & kFunctionIsAccessor) == kFunctionNone) {
        if ((FVar1 >> 0xd & 1) == 0) {
          _tempNextFunctionId = (Token *)&this->m_token;
          local_48 = &(this->m_scan).m_htbl;
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
LAB_00e6ee7a:
          do {
            while( true ) {
              Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
              tVar15 = (this->m_token).tk;
              if (tVar15 == tkID) break;
LAB_00e6eec5:
              if ((tVar15 != tkStar) && (tVar15 != tkLParen)) {
                if (tVar15 != tkFUNCTION) {
LAB_00e6eeda:
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar12 = 1;
                  lineNumber = 0x1d49;
                  error = "(m_token.tk == tkLParen || m_token.tk == tkStar)";
                  message = "m_token.tk == tkLParen || m_token.tk == tkStar";
                  goto LAB_00e6ef00;
                }
                goto LAB_00e6e99f;
              }
            }
            if (((this->m_scan).field_0x508 & 0x10) != 0) goto LAB_00e6eeda;
            pIVar7 = (this->wellKnownPropertyPids).async;
            pIVar13 = Token::GetIdentifier(_tempNextFunctionId,local_48);
            if (pIVar13 != pIVar7) {
              tVar15 = (this->m_token).tk;
              goto LAB_00e6eec5;
            }
          } while ((local_38->fncFlags & kFunctionIsAsync) != kFunctionNone);
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          lineNumber = 0x1d41;
          error = "(pnodeFnc->IsAsync())";
          message = "pnodeFnc->IsAsync()";
LAB_00e6ef00:
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                              ,lineNumber,error,message);
          if (bVar10) {
            *puVar12 = 0;
            goto LAB_00e6ee7a;
          }
          goto LAB_00e6f175;
        }
      }
      else {
        Scanner<UTF8EncodingPolicyBase<false>_>::ScanNoKeywords(this_00);
      }
    }
    else {
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      do {
        while( true ) {
          Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
          tVar15 = (this->m_token).tk;
          if (tVar15 != tkLBrack) break;
          Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
          ParseExpr<false>(this,0,(BOOL *)0x0,1,0,(LPCOLESTR)0x0,(uint32 *)0x0,(uint32 *)0x0,
                           (IdentToken *)0x0,false,(bool *)0x0,(charcount_t *)0x0,(bool *)0x0);
          if ((this->m_token).tk != tkRBrack) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar12 = 1;
            bVar10 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                ,0x1d2a,"(m_token.tk == tkRBrack)","m_token.tk == tkRBrack");
            if (!bVar10) goto LAB_00e6f175;
            *puVar12 = 0;
          }
        }
      } while (tVar15 != tkLParen);
    }
  }
  else {
    Scanner<UTF8EncodingPolicyBase<false>_>::SetCurrentCharacter
              (this_00,(pnodeFnc->pnodeName->super_ParseNode).ichLim,pnodeFnc->lineNumber);
  }
LAB_00e6e99f:
  pPVar9 = local_38;
  bVar14 = (byte)(local_38->fncFlags >> 0x18);
  uVar2 = (uint)local_40;
  _tempNextFunctionId =
       (Token *)CONCAT71(stack0xffffffffffffffb1,(this->m_scan).m_fYieldIsKeywordRegion);
  local_48 = (HashTbl *)CONCAT71(local_48._1_7_,(this->m_scan).m_fAwaitIsKeywordRegion);
  (this->m_scan).m_fYieldIsKeywordRegion = (bool)(bVar14 >> 1 & 1);
  (this->m_scan).m_fAwaitIsKeywordRegion = (bool)(bVar14 >> 4 & 1);
  if (((uint)local_40 >> 0x11 & 1) == 0) {
    Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
  }
  if ((this->m_token).tk == tkStar) {
    if ((pPVar9->fncFlags & kFunctionIsGenerator) == kFunctionNone) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                          ,0x1d5b,"(pnodeFnc->IsGenerator())","pnodeFnc->IsGenerator()");
      if (!bVar10) goto LAB_00e6f175;
      *puVar12 = 0;
    }
    Scanner<UTF8EncodingPolicyBase<false>_>::ScanNoKeywords(this_00);
  }
  if (((((uVar2 >> 0xd & 1) != 0) && ((this->m_token).tk == tkID)) &&
      (((this->m_scan).field_0x508 & 0x10) == 0)) &&
     (pIVar7 = (this->wellKnownPropertyPids).async,
     pIVar13 = Token::GetIdentifier((Token *)&this->m_token,&(this->m_scan).m_htbl),
     pIVar13 == pIVar7)) {
    if ((pPVar9->fncFlags & kFunctionIsAsync) == kFunctionNone) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                          ,0x1d60,"(pnodeFnc->IsAsync())","pnodeFnc->IsAsync()");
      if (!bVar10) goto LAB_00e6f175;
      *puVar12 = 0;
    }
    Scanner<UTF8EncodingPolicyBase<false>_>::ScanNoKeywords(this_00);
  }
  tVar15 = (this->m_token).tk;
  bVar14 = (byte)(uVar2 >> 0xd);
  if ((tVar15 != tkLParen) && ((tVar15 == tkID & bVar14) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                        ,0x1d63,"(m_token.tk == tkLParen || (fLambda && m_token.tk == tkID))",
                        "m_token.tk == tkLParen || (fLambda && m_token.tk == tkID)");
    if (!bVar10) goto LAB_00e6f175;
    *puVar12 = 0;
  }
  Scanner<UTF8EncodingPolicyBase<false>_>::ScanNoKeywords(this_00);
  tVar15 = (this->m_token).tk;
  if ((tVar15 == tkRParen) || (tVar15 == tkDArrow)) {
LAB_00e6eb97:
    if (tVar15 == tkRParen) goto LAB_00e6eb9d;
  }
  else {
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      if (tVar15 == tkEllipsis) {
        Scanner<UTF8EncodingPolicyBase<false>_>::ScanNoKeywords(this_00);
        tVar15 = (this->m_token).tk;
      }
      if ((tVar15 == tkLBrack) || (tVar15 == tkLCurly)) {
        ParseDestructuredLiteralWithScopeSave(this,tkLET,false,false,DIC_None,true);
LAB_00e6f05b:
        tVar15 = (this->m_token).tk;
      }
      else {
        if (tVar15 != tkID) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                              ,0x1d80,"(false)",
                              "Unexpected identifier prefix while fast-scanning formals");
          if (bVar10) {
            *puVar12 = 0;
            goto LAB_00e6f05b;
          }
          goto LAB_00e6f175;
        }
        Scanner<UTF8EncodingPolicyBase<false>_>::ScanNoKeywords(this_00);
        tVar15 = (this->m_token).tk;
        if (tVar15 == tkAsg) {
          Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
          ParseExpr<false>(this,1,(BOOL *)0x0,1,0,(LPCOLESTR)0x0,(uint32 *)0x0,(uint32 *)0x0,
                           (IdentToken *)0x0,false,(bool *)0x0,(charcount_t *)0x0,(bool *)0x0);
          goto LAB_00e6f05b;
        }
      }
      if (tVar15 != tkComma) goto LAB_00e6eb97;
      Scanner<UTF8EncodingPolicyBase<false>_>::ScanNoKeywords(this_00);
      tVar15 = (this->m_token).tk;
    } while ((tVar15 != tkRParen) ||
            (((this->m_scriptContext->config).threadConfig)->m_ES7TrailingComma == false));
LAB_00e6eb9d:
    Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
    tVar15 = (this->m_token).tk;
  }
  if ((((uint)local_40 >> 0xd & 1) != 0) && (tVar15 == tkDArrow)) {
    Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
  }
  pPVar9 = local_38;
  uVar2 = (local_38->super_ParseNode).ichLim;
  local_40 = local_38->cbLim;
  FinishFncDecl(this,local_38,(LPCOLESTR)0x0,(bool)(bVar14 & 1),false,local_54._0_1_);
  offset = (pPVar9->super_ParseNode).ichLim;
  if (offset != uVar2) {
    if (uVar2 <= offset) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                          ,0x1da8,"(pnodeFnc->ichLim < ichLim)","pnodeFnc->ichLim < ichLim");
      if (!bVar10) goto LAB_00e6f175;
      *puVar12 = 0;
      offset = (local_38->super_ParseNode).ichLim;
    }
    Scanner<UTF8EncodingPolicyBase<false>_>::SetCurrentCharacter(this_00,offset,0);
    cVar11 = Scanner<UTF8EncodingPolicyBase<false>_>::IchLimTok(this_00);
    if (cVar11 != uVar2) {
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      do {
        Scanner<UTF8EncodingPolicyBase<false>_>::ScanNoKeywords(this_00);
        if ((this->m_token).tk != tkRParen) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                              ,0x1dad,"(m_token.tk == tkRParen)","m_token.tk == tkRParen");
          if (!bVar10) goto LAB_00e6f175;
          *puVar12 = 0;
        }
        cVar11 = Scanner<UTF8EncodingPolicyBase<false>_>::IchLimTok(this_00);
      } while (cVar11 != uVar2);
    }
  }
  pPVar9 = local_38;
  (local_38->super_ParseNode).ichLim = uVar2;
  local_38->cbLim = local_40;
  this->m_currentNodeFunc = pPVar4;
  this->m_pCurrentAstSize = piVar5;
  this->m_pnestedCount = puVar6;
  if (puVar6 == (uint *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                        ,0x1db8,"(m_pnestedCount)","m_pnestedCount");
    if (!bVar10) goto LAB_00e6f175;
    *puVar12 = 0;
  }
  if (local_58 != pPVar9->deferredParseNextFunctionId) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                        ,0x1dba,"(tempNextFunctionId == pnodeFnc->deferredParseNextFunctionId)",
                        "tempNextFunctionId == pnodeFnc->deferredParseNextFunctionId");
    if (!bVar10) {
LAB_00e6f175:
      pcVar8 = (code *)invalidInstructionException();
      (*pcVar8)();
    }
    *puVar12 = 0;
  }
  this->m_nextFunctionId = pLVar3;
  (this->m_scan).m_fYieldIsKeywordRegion = tempNextFunctionId._0_1_;
  (this->m_scan).m_fAwaitIsKeywordRegion = local_48._0_1_;
  return;
}

Assistant:

void Parser::FinishFncNode(ParseNodeFnc * pnodeFnc, bool fAllowIn)
{
    AnalysisAssert(pnodeFnc);

    // Finish the AST for a function that was deferred earlier, but which we decided
    // to finish after the fact.
    // We assume that the name(s) and arg(s) have already got parse nodes, so
    // we just have to do the function body.

    // Save the current next function Id, and resume from the old one.
    Js::LocalFunctionId * nextFunctionIdSave = m_nextFunctionId;
    Js::LocalFunctionId tempNextFunctionId = pnodeFnc->functionId + 1;
    this->m_nextFunctionId = &tempNextFunctionId;

    ParseNodeFnc * pnodeFncSave = m_currentNodeFunc;
    uint *pnestedCountSave = m_pnestedCount;
    int32* pAstSizeSave = m_pCurrentAstSize;

    m_currentNodeFunc = pnodeFnc;
    m_pCurrentAstSize = &(pnodeFnc->astSize);

    pnodeFnc->nestedCount = 0;
    m_pnestedCount = &pnodeFnc->nestedCount;

    bool fLambda = pnodeFnc->IsLambda();
    bool fMethod = pnodeFnc->IsMethod();

    // Cue up the parser to the start of the function body.
    if (pnodeFnc->pnodeName)
    {
        // Skip the name(s).
        this->GetScanner()->SetCurrentCharacter(pnodeFnc->pnodeName->ichLim, pnodeFnc->lineNumber);
    }
    else
    {
        this->GetScanner()->SetCurrentCharacter(pnodeFnc->ichMin, pnodeFnc->lineNumber);

        if (fMethod)
        {
            // Method. Skip identifier name, computed property name, "async", "get", "set", and '*' or '(' characters.
            for (;;)
            {
                this->GetScanner()->Scan();
                // '[' character indicates a computed property name for this method. We should consume it.
                if (m_token.tk == tkLBrack)
                {
                    // We don't care what the name expr is.
                    this->GetScanner()->Scan();
                    ParseExpr<false>();
                    Assert(m_token.tk == tkRBrack);
                    continue;
                }
                // Quit scanning ahead when we reach a '(' character which opens the arg list.
                if (m_token.tk == tkLParen)
                {
                    break;
                }
            }
        }
        else if (pnodeFnc->IsAccessor())
        {
            // Getter/setter. The node text starts with the name, so eat that.
            this->GetScanner()->ScanNoKeywords();
        }
        else if (!fLambda)
        {
            // Anonymous function. Skip "async", "function", and '(' or '*' characters.
            for (;;)
            {
                this->GetScanner()->Scan();
                if (CheckContextualKeyword(wellKnownPropertyPids.async))
                {
                    Assert(pnodeFnc->IsAsync());
                    continue;
                }
                // Quit scanning ahead when we reach a 'function' keyword which precedes the arg list.
                if (m_token.tk == tkFUNCTION)
                {
                    break;
                }
                Assert(m_token.tk == tkLParen || m_token.tk == tkStar);
            }
        }
    }

    // switch scanner to treat 'yield' as keyword in generator functions
    // or as an identifier in non-generator functions
    bool fPreviousYieldIsKeyword = this->GetScanner()->SetYieldIsKeywordRegion(pnodeFnc && pnodeFnc->IsGenerator());
    bool fPreviousAwaitIsKeyword = this->GetScanner()->SetAwaitIsKeywordRegion(pnodeFnc && pnodeFnc->IsAsync());

    // Skip the arg list.
    if (!fMethod)
    {
        // If this is a method, we've already advanced to the '(' token.
        this->GetScanner()->Scan();
    }
    if (m_token.tk == tkStar)
    {
        Assert(pnodeFnc->IsGenerator());
        this->GetScanner()->ScanNoKeywords();
    }
    if (fLambda && CheckContextualKeyword(wellKnownPropertyPids.async))
    {
        Assert(pnodeFnc->IsAsync());
        this->GetScanner()->ScanNoKeywords();
    }
    Assert(m_token.tk == tkLParen || (fLambda && m_token.tk == tkID));
    this->GetScanner()->ScanNoKeywords();

    if (m_token.tk != tkRParen && m_token.tk != tkDArrow)
    {
        for (;;)
        {
            if (m_token.tk == tkEllipsis)
            {
                this->GetScanner()->ScanNoKeywords();
            }

            if (m_token.tk == tkID)
            {
                this->GetScanner()->ScanNoKeywords();

                if (m_token.tk == tkAsg)
                {
                    // Eat the default expression
                    this->GetScanner()->Scan();
                    ParseExpr<false>(koplCma);
                }
            }
            else if (IsPossiblePatternStart())
            {
                ParseDestructuredLiteralWithScopeSave(tkLET, false/*isDecl*/, false /*topLevel*/);
            }
            else
            {
                AssertMsg(false, "Unexpected identifier prefix while fast-scanning formals");
            }

            if (m_token.tk != tkComma)
            {
                break;
            }
            this->GetScanner()->ScanNoKeywords();

            if (m_token.tk == tkRParen && m_scriptContext->GetConfig()->IsES7TrailingCommaEnabled())
            {
                break;
            }
        }
    }

    if (m_token.tk == tkRParen)
    {
        this->GetScanner()->Scan();
    }
    if (fLambda && m_token.tk == tkDArrow)
    {
        this->GetScanner()->Scan();
    }

    // Finish the function body.
    {
        // Note that in IE8- modes, surrounding parentheses are considered part of function body. e.g. "( function x(){} )".
        // We lose that context here since we start from middle of function body. So save and restore source range info.
        const charcount_t ichLim = pnodeFnc->ichLim;
        const size_t cbLim = pnodeFnc->cbLim;

        this->FinishFncDecl(pnodeFnc, NULL, fLambda, /* skipCurlyBraces */ false, fAllowIn);

#if DBG
        // The pnode extent may not match the original extent.
        // We expect this to happen only when there are trailing ")"'s.
        // Consume them and make sure that's all we've got.
        if (pnodeFnc->ichLim != ichLim)
        {
            Assert(pnodeFnc->ichLim < ichLim);
            this->GetScanner()->SetCurrentCharacter(pnodeFnc->ichLim);
            while (this->GetScanner()->IchLimTok() != ichLim)
            {
                this->GetScanner()->ScanNoKeywords();
                Assert(m_token.tk == tkRParen);
            }
        }
#endif
        pnodeFnc->ichLim = ichLim;
        pnodeFnc->cbLim = cbLim;
    }

    m_currentNodeFunc = pnodeFncSave;
    m_pCurrentAstSize = pAstSizeSave;
    m_pnestedCount = pnestedCountSave;
    Assert(m_pnestedCount);

    Assert(tempNextFunctionId == pnodeFnc->deferredParseNextFunctionId);
    this->m_nextFunctionId = nextFunctionIdSave;

    this->GetScanner()->SetYieldIsKeywordRegion(fPreviousYieldIsKeyword);
    this->GetScanner()->SetAwaitIsKeywordRegion(fPreviousAwaitIsKeyword);
}